

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O1

int __thiscall RSTARPlanner::SetSearchStartState(RSTARPlanner *this,int SearchStartStateID)

{
  RSTARSearchStateSpace_t *pRVar1;
  CMDPSTATE *pCVar2;
  
  pCVar2 = GetState(this,SearchStartStateID);
  pRVar1 = this->pSearchStateSpace;
  if (pCVar2 != pRVar1->searchstartstate) {
    pRVar1->searchstartstate = pCVar2;
    pRVar1->bReinitializeSearchStateSpace = true;
    pRVar1->eps_satisfied = 1000000000.0;
  }
  return 1;
}

Assistant:

int RSTARPlanner::SetSearchStartState(int SearchStartStateID)
{
    CMDPSTATE* MDPstate = GetState(SearchStartStateID);

    if (MDPstate != pSearchStateSpace->searchstartstate) {
        pSearchStateSpace->searchstartstate = MDPstate;
        pSearchStateSpace->bReinitializeSearchStateSpace = true;
        pSearchStateSpace->eps_satisfied = INFINITECOST;
    }

    return 1;
}